

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

long openjtalk_getWideCharCode(char16_t *text)

{
  ulong uVar1;
  
  if (text == (char16_t *)0x0) {
    return 0xc;
  }
  uVar1 = (ulong)*text;
  if (uVar1 != 0) {
    if (text[1] != 0) {
      uVar1 = (ulong)CONCAT22(*text,text[1]);
    }
    return uVar1;
  }
  return 0;
}

Assistant:

OPENJTALK_DLL_API long OPENJTALK_CONVENTION openjtalk_getWideCharCode(char16_t *text)
{
	if (!text)
	{
		return OPENJTALKERROR_BUFFER_IS_NULL;
	}
	long res = 0;
	int count = 0;
	for (char16_t *p = text; *p != '\0'; p++)
	{
		res <<= sizeof(char16_t) * 8;
		res += ((long)*p) & 0xffff;
		if (++count == 2)
		{
			break;
		}
	}
	return (long)res;
}